

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O0

ec_curve * ec_ed448(void)

{
  mp_int *p_00;
  mp_int *d_00;
  mp_int *a_00;
  mp_int *G_x_00;
  mp_int *G_y_00;
  mp_int *G_order_00;
  mp_int *nonsquare;
  mp_int *nonsquare_mod_p;
  mp_int *G_order;
  mp_int *G_y;
  mp_int *G_x;
  mp_int *a;
  mp_int *d;
  mp_int *p;
  
  if (!ec_ed448::initialised) {
    p_00 = mp__from_string_literal
                     (
                     "0xfffffffffffffffffffffffffffffffffffffffffffffffffffffffeffffffffffffffffffffffffffffffffffffffffffffffffffffffff"
                     );
    d_00 = mp__from_string_literal
                     (
                     "0xfffffffffffffffffffffffffffffffffffffffffffffffffffffffeffffffffffffffffffffffffffffffffffffffffffffffffffff6756"
                     );
    a_00 = mp__from_string_literal("0x1");
    G_x_00 = mp__from_string_literal
                       (
                       "0x4f1970c66bed0ded221d15a622bf36da9e146570470f1767ea6de324a3d3a46412ae1af72ab66511433b80e18b00938e2626a82bc70cc05e"
                       );
    G_y_00 = mp__from_string_literal
                       (
                       "0x693f46716eb6bc248876203756c9c7624bea73736ca3984087789c1e05a0c2d73ad3ff1ce67c39c4fdbd132c4ed7c8ad9808795bf230fa14"
                       );
    G_order_00 = mp__from_string_literal
                           (
                           "0x3fffffffffffffffffffffffffffffffffffffffffffffffffffffff7cca23e9c44edb49aed63690216cc2728dc58f552378c292ab5844f3"
                           );
    nonsquare = mp_from_integer(7);
    initialise_ecurve(&ec_ed448::curve,p_00,d_00,a_00,nonsquare,G_x_00,G_y_00,G_order_00,2);
    mp_free(p_00);
    mp_free(d_00);
    mp_free(a_00);
    mp_free(G_x_00);
    mp_free(G_y_00);
    mp_free(G_order_00);
    mp_free(nonsquare);
    ec_ed448::curve.name = (char *)0x0;
    ec_ed448::curve.textname = "Ed448";
    ec_ed448::initialised = true;
  }
  return &ec_ed448::curve;
}

Assistant:

static struct ec_curve *ec_ed448(void)
{
    static struct ec_curve curve = { 0 };
    static bool initialised = false;

    if (!initialised)
    {
        mp_int *p = MP_LITERAL(0xfffffffffffffffffffffffffffffffffffffffffffffffffffffffeffffffffffffffffffffffffffffffffffffffffffffffffffffffff);
        mp_int *d = MP_LITERAL(0xfffffffffffffffffffffffffffffffffffffffffffffffffffffffeffffffffffffffffffffffffffffffffffffffffffffffffffff6756); /* = p - 39081 */
        mp_int *a = MP_LITERAL(0x1);
        mp_int *G_x = MP_LITERAL(0x4f1970c66bed0ded221d15a622bf36da9e146570470f1767ea6de324a3d3a46412ae1af72ab66511433b80e18b00938e2626a82bc70cc05e);
        mp_int *G_y = MP_LITERAL(0x693f46716eb6bc248876203756c9c7624bea73736ca3984087789c1e05a0c2d73ad3ff1ce67c39c4fdbd132c4ed7c8ad9808795bf230fa14);
        mp_int *G_order = MP_LITERAL(0x3fffffffffffffffffffffffffffffffffffffffffffffffffffffff7cca23e9c44edb49aed63690216cc2728dc58f552378c292ab5844f3);
        mp_int *nonsquare_mod_p = mp_from_integer(7);
        initialise_ecurve(&curve, p, d, a, nonsquare_mod_p,
                          G_x, G_y, G_order, 2);
        mp_free(p);
        mp_free(d);
        mp_free(a);
        mp_free(G_x);
        mp_free(G_y);
        mp_free(G_order);
        mp_free(nonsquare_mod_p);

        /* This curve doesn't need a name, because it's never used in
         * any format that embeds the curve name */
        curve.name = NULL;

        curve.textname = "Ed448";

        /* Now initialised, no need to do it again */
        initialised = true;
    }

    return &curve;
}